

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_std_vector.hpp
# Opt level: O0

const_reference Omega_h::at<int>(vector<int,_std::allocator<int>_> *v,int i)

{
  size_type sVar1;
  const_reference pvVar2;
  int i_local;
  vector<int,_std::allocator<int>_> *v_local;
  
  if (i < 0) {
    fail("assertion %s failed at %s +%d\n","0 <= i",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
         ,0x1d);
  }
  sVar1 = std::vector<int,_std::allocator<int>_>::size(v);
  if (i < (int)sVar1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](v,(long)i);
    return pvVar2;
  }
  fail("assertion %s failed at %s +%d\n","i < int(v.size())",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
       ,0x1e);
}

Assistant:

inline typename std::vector<T>::const_reference at(
    std::vector<T> const& v, int i) {
  OMEGA_H_CHECK(0 <= i);
  OMEGA_H_CHECK(i < int(v.size()));
  return v[std::size_t(i)];
}